

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.h
# Opt level: O3

void tokenize<std::vector<substring,std::allocator<substring>>>
               (char delim,substring s,vector<substring,_std::allocator<substring>_> *ret,
               bool allow_empty)

{
  pointer *ppsVar1;
  pointer psVar2;
  iterator iVar3;
  char *pcVar4;
  substring temp;
  substring local_40;
  
  local_40.begin = s.begin;
  psVar2 = (ret->super__Vector_base<substring,_std::allocator<substring>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((ret->super__Vector_base<substring,_std::allocator<substring>_>)._M_impl.
      super__Vector_impl_data._M_finish != psVar2) {
    (ret->super__Vector_base<substring,_std::allocator<substring>_>)._M_impl.super__Vector_impl_data
    ._M_finish = psVar2;
  }
  pcVar4 = local_40.begin;
  if (local_40.begin != s.end) {
    do {
      if (*pcVar4 == delim) {
        if (pcVar4 != local_40.begin || allow_empty) {
          iVar3._M_current =
               (ret->super__Vector_base<substring,_std::allocator<substring>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (ret->super__Vector_base<substring,_std::allocator<substring>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_40.end = pcVar4;
            std::vector<substring,std::allocator<substring>>::_M_realloc_insert<substring_const&>
                      ((vector<substring,std::allocator<substring>> *)ret,iVar3,&local_40);
          }
          else {
            (iVar3._M_current)->begin = local_40.begin;
            (iVar3._M_current)->end = pcVar4;
            ppsVar1 = &(ret->super__Vector_base<substring,_std::allocator<substring>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppsVar1 = *ppsVar1 + 1;
          }
        }
        local_40.begin = pcVar4 + 1;
      }
      pcVar4 = pcVar4 + 1;
    } while (pcVar4 != s.end);
  }
  if (allow_empty || pcVar4 != local_40.begin) {
    iVar3._M_current =
         (ret->super__Vector_base<substring,_std::allocator<substring>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (ret->super__Vector_base<substring,_std::allocator<substring>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_40.end = pcVar4;
      std::vector<substring,std::allocator<substring>>::_M_realloc_insert<substring_const&>
                ((vector<substring,std::allocator<substring>> *)ret,iVar3,&local_40);
    }
    else {
      (iVar3._M_current)->begin = local_40.begin;
      (iVar3._M_current)->end = pcVar4;
      ppsVar1 = &(ret->super__Vector_base<substring,_std::allocator<substring>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppsVar1 = *ppsVar1 + 1;
    }
  }
  return;
}

Assistant:

void tokenize(char delim, substring s, ContainerT& ret, bool allow_empty = false)
{
  ret.clear();
  char* last = s.begin;
  for (; s.begin != s.end; s.begin++)
  {
    if (*s.begin == delim)
    {
      if (allow_empty || (s.begin != last))
      {
        substring temp = {last, s.begin};
        ret.push_back(temp);
      }
      last = s.begin + 1;
    }
  }
  if (allow_empty || (s.begin != last))
  {
    substring final_substring = {last, s.begin};
    ret.push_back(final_substring);
  }
}